

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int ConnectMTx(MT *pMT,char *szCfgFilePath)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  char *szCfgFilePath_local;
  MT *pMT_local;
  
  local_24 = 0;
  do {
    if (addrsMT[local_24] == (void *)0x0) {
      iVar1 = ConnectMT(pMT,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsMT[local_24] = pMT;
      return 0;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectMTx(MT* pMT, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsMT[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectMT(pMT, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsMT[id] = pMT;

	return EXIT_SUCCESS;
}